

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O0

string * __thiscall
iutest::detail::iuCodeMessage::make_newline_message_abi_cxx11_
          (string *__return_storage_ptr__,iuCodeMessage *this)

{
  string local_38;
  iuCodeMessage *local_18;
  iuCodeMessage *this_local;
  
  local_18 = this;
  this_local = (iuCodeMessage *)__return_storage_ptr__;
  make_message_abi_cxx11_(&local_38,this);
  std::operator+(__return_storage_ptr__,&local_38,"\n");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

::std::string make_newline_message() const
    {
        return make_message() + "\n";
    }